

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O1

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  double dVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  
  lVar6 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar4 = *(double *)((long)user_data + 0x58);
  lVar8 = N_VGetArrayPointer();
  if (lVar8 == 0) {
    ff_cold_2();
  }
  else {
    puVar9 = (undefined8 *)N_VGetArrayPointer(ydot);
    if (puVar9 != (undefined8 *)0x0) {
      N_VConst(0,ydot);
      if (2 < lVar6) {
        lVar11 = lVar6 + -2;
        lVar10 = 0x28;
        do {
          pdVar1 = (double *)(lVar8 + -0x10 + lVar10);
          dVar7 = *pdVar1;
          dVar5 = *(double *)(lVar8 + lVar10);
          dVar12 = pdVar1[1] * dVar7;
          pdVar1 = (double *)((long)puVar9 + lVar10 + -0x10);
          *pdVar1 = dVar7 * dVar12 + (dVar2 - (dVar5 + 1.0) * dVar7);
          pdVar1[1] = dVar7 * dVar5 + -dVar12 * dVar7;
          *(double *)((long)puVar9 + lVar10) = (dVar3 - dVar5) / dVar4 - dVar5 * dVar7;
          lVar10 = lVar10 + 0x18;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9[2] = 0;
      puVar9[(lVar6 + -1) * 3 + 2] = 0;
      puVar9[(lVar6 + -1) * 3] = 0;
      (puVar9 + (lVar6 + -1) * 3)[1] = 0;
      return 0;
    }
    ff_cold_1();
  }
  return 1;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype a      = udata->a;
  sunrealtype b      = udata->b;
  sunrealtype ep     = udata->ep;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype u, v, w;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = a - (w + ONE) * u + v * u * u;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = w * u - v * u * u;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (b - w) / ep - w * u;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}